

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floattype.cpp
# Opt level: O3

Token * __thiscall
FloatType::parseNumber
          (Token *__return_storage_ptr__,FloatType *this,string *str,char *current,size_t *index)

{
  Token *pTVar1;
  bool bVar2;
  int iVar3;
  runtime_error *this_00;
  ulong uVar4;
  bool bVar5;
  initializer_list<NumericConstantChar> __l;
  NumericChars chars;
  NumericConstantChar local_72;
  allocator_type local_71;
  vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> local_70;
  Token *local_58;
  NumericConstant local_50;
  
  local_58 = __return_storage_ptr__;
  local_72 = NumericConstantChars::getChar(*current);
  __l._M_len = 1;
  __l._M_array = &local_72;
  std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::vector
            (&local_70,__l,&local_71);
  uVar4 = *index + 1;
  if (uVar4 < str->_M_string_length) {
    bVar5 = false;
    do {
      iVar3 = tolower((int)(str->_M_dataplus)._M_p[uVar4]);
      *current = (char)iVar3;
      if (iVar3 << 0x18 == 0x2e000000) {
        bVar2 = true;
        if (bVar5) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"The token already contains a decimal point.");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        bVar2 = bVar5;
        if (9 < ((iVar3 << 0x18) >> 0x18) - 0x30U) break;
      }
      bVar5 = bVar2;
      local_72 = NumericConstantChars::getChar((char)iVar3);
      if (local_70.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_70.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::
        _M_realloc_insert<NumericConstantChar>
                  (&local_70,
                   (iterator)
                   local_70.
                   super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_72);
      }
      else {
        *local_70.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_72;
        local_70.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_70.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      *index = uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar4 < str->_M_string_length);
  }
  NumericConstant::NumericConstant(&local_50,&local_70);
  pTVar1 = local_58;
  Token::Token(local_58,&local_50);
  if (local_50.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.mChars.
                    super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.mChars.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.mChars.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar1;
}

Assistant:

Token FloatType::parseNumber(std::string& str, char& current, std::size_t& index) const {
	NumericChars chars({ NumericConstantChars::getChar(current) });
	bool hasDecimalPoint = false;

	while (true) {
		std::size_t next = index + 1;

		if (next >= str.size()) {
			break;
		}

		current = (char)std::tolower(str[next]);

		if (current == '.') {
			if (!hasDecimalPoint) {
				hasDecimalPoint = true;
			} else {
				throw std::runtime_error("The token already contains a decimal point.");
			}
		} else {
			if (!isdigit(current)) {
				break;
			}
		}

		chars.push_back(NumericConstantChars::getChar(current));
		index = next;
	}

	return NumericConstant(chars);
}